

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatserver.cpp
# Opt level: O2

void ChatServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == logMessage) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      logMessage((ChatServer *)_o,(QString *)_a[1]);
      return;
    case 1:
      stopServer((ChatServer *)_o);
      return;
    case 2:
      broadcast((ChatServer *)_o,(QJsonObject *)_a[1],*_a[2]);
      return;
    case 3:
      jsonReceived((ChatServer *)_o,*_a[1],(QJsonObject *)_a[2]);
      return;
    case 4:
      userDisconnected((ChatServer *)_o,*_a[1]);
      return;
    case 5:
      userError((ChatServer *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void ChatServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ChatServer *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->logMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->stopServer(); break;
        case 2: _t->broadcast((*reinterpret_cast< std::add_pointer_t<QJsonObject>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<ServerWorker*>>(_a[2]))); break;
        case 3: _t->jsonReceived((*reinterpret_cast< std::add_pointer_t<ServerWorker*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QJsonObject>>(_a[2]))); break;
        case 4: _t->userDisconnected((*reinterpret_cast< std::add_pointer_t<ServerWorker*>>(_a[1]))); break;
        case 5: _t->userError((*reinterpret_cast< std::add_pointer_t<ServerWorker*>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ChatServer::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatServer::logMessage)) {
                *result = 0;
                return;
            }
        }
    }
}